

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O2

void __thiscall gui::Slider::handleMousePress(Slider *this,Button button,Vector2f *mouseParent)

{
  Vector2f VVar1;
  Vector2f *pVVar2;
  float local_28;
  
  Widget::handleMousePress(&this->super_Widget,button,mouseParent);
  VVar1 = Widget::toLocalOriginSpace(&this->super_Widget,mouseParent);
  if ((button == Left) && (this->isDragging_ == false)) {
    pVVar2 = Widget::getOrigin(&this->super_Widget);
    local_28 = VVar1.x;
    updateThumb(this,local_28 + pVVar2->x);
    this->isDragging_ = true;
    Widget::requestRedraw(&this->super_Widget);
    return;
  }
  return;
}

Assistant:

void Slider::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left && !isDragging_) {
        updateThumb(mouseLocal.x + getOrigin().x);
        isDragging_ = true;
        requestRedraw();
    }
}